

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiWindow *potential_parent;
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiHoveredFlags flags_local;
  
  pIVar1 = GImGui;
  if ((flags & 0x40U) != 0) {
    __assert_fail("(flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x19f2,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
  }
  if (GImGui->HoveredWindow != (ImGuiWindow *)0x0) {
    if ((flags & 4U) == 0) {
      potential_parent = GImGui->CurrentWindow;
      uVar3 = flags & 3;
      if (uVar3 == 1) {
        bVar2 = IsWindowChildOf(GImGui->HoveredWindow,potential_parent);
        if (!bVar2) {
          return false;
        }
      }
      else if (uVar3 == 2) {
        if (GImGui->HoveredWindow != potential_parent->RootWindow) {
          return false;
        }
      }
      else if (uVar3 == 3) {
        if (GImGui->HoveredWindow->RootWindow != potential_parent->RootWindow) {
          return false;
        }
      }
      else if (GImGui->HoveredWindow != potential_parent) {
        return false;
      }
    }
    bVar2 = IsWindowContentHoverable(pIVar1->HoveredWindow,flags);
    if (bVar2) {
      if (((((flags & 0x20U) == 0) && (pIVar1->ActiveId != 0)) &&
          ((pIVar1->ActiveIdAllowOverlap & 1U) == 0)) &&
         (pIVar1->ActiveId != pIVar1->HoveredWindow->MoveId)) {
        g._7_1_ = false;
      }
      else {
        g._7_1_ = true;
      }
    }
    else {
      g._7_1_ = false;
    }
    return g._7_1_;
  }
  return false;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & ImGuiHoveredFlags_AllowWhenOverlapped) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;
    if (g.HoveredWindow == NULL)
        return false;

    if ((flags & ImGuiHoveredFlags_AnyWindow) == 0)
    {
        ImGuiWindow* window = g.CurrentWindow;
        switch (flags & (ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows))
        {
        case ImGuiHoveredFlags_RootWindow | ImGuiHoveredFlags_ChildWindows:
            if (g.HoveredWindow->RootWindow != window->RootWindow)
                return false;
            break;
        case ImGuiHoveredFlags_RootWindow:
            if (g.HoveredWindow != window->RootWindow)
                return false;
            break;
        case ImGuiHoveredFlags_ChildWindows:
            if (!IsWindowChildOf(g.HoveredWindow, window))
                return false;
            break;
        default:
            if (g.HoveredWindow != window)
                return false;
            break;
        }
    }

    if (!IsWindowContentHoverable(g.HoveredWindow, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != g.HoveredWindow->MoveId)
            return false;
    return true;
}